

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mat.cpp
# Opt level: O2

bool __thiscall Mat::operator==(Mat *this,Mat *p)

{
  char *pcVar1;
  char *pcVar2;
  ulong uVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  ulong uVar7;
  undefined1 auVar8 [16];
  
  uVar4 = (long)this->c * (long)this->r;
  lVar5 = 0;
  uVar6 = 0;
  if (0 < (int)uVar4) {
    uVar6 = uVar4 & 0xffffffff;
  }
  uVar3 = 0;
  do {
    uVar7 = uVar3;
    if (uVar6 == uVar7) break;
    pcVar1 = (char *)((long)(this->val).super__Vector_base<__int128,_std::allocator<__int128>_>.
                            _M_impl.super__Vector_impl_data._M_start + lVar5);
    pcVar2 = (char *)((long)(p->val).super__Vector_base<__int128,_std::allocator<__int128>_>._M_impl
                            .super__Vector_impl_data._M_start + lVar5);
    auVar8[0] = -(*pcVar1 == *pcVar2);
    auVar8[1] = -(pcVar1[1] == pcVar2[1]);
    auVar8[2] = -(pcVar1[2] == pcVar2[2]);
    auVar8[3] = -(pcVar1[3] == pcVar2[3]);
    auVar8[4] = -(pcVar1[4] == pcVar2[4]);
    auVar8[5] = -(pcVar1[5] == pcVar2[5]);
    auVar8[6] = -(pcVar1[6] == pcVar2[6]);
    auVar8[7] = -(pcVar1[7] == pcVar2[7]);
    auVar8[8] = -(pcVar1[8] == pcVar2[8]);
    auVar8[9] = -(pcVar1[9] == pcVar2[9]);
    auVar8[10] = -(pcVar1[10] == pcVar2[10]);
    auVar8[0xb] = -(pcVar1[0xb] == pcVar2[0xb]);
    auVar8[0xc] = -(pcVar1[0xc] == pcVar2[0xc]);
    auVar8[0xd] = -(pcVar1[0xd] == pcVar2[0xd]);
    auVar8[0xe] = -(pcVar1[0xe] == pcVar2[0xe]);
    auVar8[0xf] = -(pcVar1[0xf] == pcVar2[0xf]);
    lVar5 = lVar5 + 0x10;
    uVar3 = uVar7 + 1;
  } while ((ushort)((ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1
                    | (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
                    (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
                    (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
                    (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
                    (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
                    (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
                    (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
                    (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
                    (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
                    (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
                    (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
                    (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
                    (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe |
                   (ushort)(auVar8[0xf] >> 7) << 0xf) == 0xffff);
  return (long)uVar4 <= (long)uVar7;
}

Assistant:

bool Mat::operator==(Mat p) {
    int l = r * c;
//    bool match = true;
    for (int i = 0; i < l; i++) {
        if (val[i] != p.getVal(i)) {
            return false;
        }
    }
    return true;
}